

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::X3DImporter::GeometryHelper_MakeMesh
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  aiMesh *paVar4;
  ulong *puVar5;
  ulong uVar6;
  aiVector3D *__s;
  runtime_error *this_00;
  aiFace *paVar7;
  ulong uVar8;
  _Self __tmp;
  long lVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  aiFace *paVar12;
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  uint local_6c;
  vector<aiFace,_std::allocator<aiFace>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6c = 0;
  GeometryHelper_CoordIdxStr2FacesArr(this,pCoordIdx,&local_68,&local_6c);
  lVar9 = (long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar8 = (long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to create mesh, faces list is empty.","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar4 = (aiMesh *)operator_new(0x520);
  uVar10 = lVar9 >> 4;
  paVar4->mPrimitiveTypes = 0;
  paVar4->mNumVertices = 0;
  paVar4->mNumFaces = 0;
  memset(&paVar4->mVertices,0,0xcc);
  paVar4->mBones = (aiBone **)0x0;
  paVar4->mMaterialIndex = 0;
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  paVar4->mNumAnimMeshes = 0;
  paVar4->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar4->mMethod = 0;
  (paVar4->mAABB).mMin.x = 0.0;
  (paVar4->mAABB).mMin.y = 0.0;
  (paVar4->mAABB).mMin.z = 0.0;
  (paVar4->mAABB).mMax.x = 0.0;
  (paVar4->mAABB).mMax.y = 0.0;
  (paVar4->mAABB).mMax.z = 0.0;
  memset(paVar4->mColors,0,0xa0);
  puVar5 = (ulong *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar8 | 8);
  *puVar5 = uVar10;
  paVar12 = (aiFace *)(puVar5 + 1);
  paVar7 = paVar12;
  do {
    paVar7->mNumIndices = 0;
    paVar7->mIndices = (uint *)0x0;
    paVar7 = paVar7 + 1;
  } while (paVar7 != (aiFace *)((long)puVar5 + uVar8 + 8));
  paVar4->mFaces = paVar12;
  paVar4->mNumFaces = (uint)uVar10;
  lVar9 = 0;
  uVar8 = 0;
  do {
    if ((ulong)((long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) <= uVar8) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
    }
    aiFace::operator=((aiFace *)((long)&paVar12->mNumIndices + lVar9),
                      (aiFace *)
                      ((long)&(local_68.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                               super__Vector_impl_data._M_start)->mNumIndices + lVar9));
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x10;
  } while (uVar10 + (uVar10 == 0) != uVar8);
  p_Var11 = (pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar8 = (pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl._M_node._M_size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar10 = uVar6;
  }
  __s = (aiVector3D *)operator_new__(uVar10);
  if (uVar8 == 0) {
    paVar4->mVertices = __s;
    paVar4->mNumVertices = 0;
  }
  else {
    memset(__s,0,((uVar6 - 0xc) / 0xc) * 0xc + 0xc);
    paVar4->mVertices = __s;
    paVar4->mNumVertices = (uint)uVar8;
    do {
      p_Var1 = p_Var11[1]._M_next;
      p_Var3 = p_Var11 + 1;
      p_Var11 = p_Var11->_M_next;
      __s->z = *(float *)&p_Var3->_M_prev;
      *(_List_node_base **)__s = p_Var1;
      __s = __s + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  paVar4->mPrimitiveTypes = local_6c;
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_68);
  return paVar4;
}

Assistant:

aiMesh* X3DImporter::GeometryHelper_MakeMesh(const std::vector<int32_t>& pCoordIdx, const std::list<aiVector3D>& pVertices) const
{
    std::vector<aiFace> faces;
    unsigned int prim_type = 0;

	// create faces array from input string with vertices indices.
	GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
    if ( !faces.size() )
    {
        throw DeadlyImportError( "Failed to create mesh, faces list is empty." );
    }

	//
	// Create new mesh and copy geometry data.
	//
    aiMesh *tmesh = new aiMesh;
    size_t ts = faces.size();
	// faces
	tmesh->mFaces = new aiFace[ts];
	tmesh->mNumFaces = static_cast<unsigned int>(ts);
	for(size_t i = 0; i < ts; i++) tmesh->mFaces[i] = faces.at(i);

	// vertices
	std::list<aiVector3D>::const_iterator vit = pVertices.begin();

	ts = pVertices.size();
	tmesh->mVertices = new aiVector3D[ts];
	tmesh->mNumVertices = static_cast<unsigned int>(ts);
    for ( size_t i = 0; i < ts; i++ )
    {
        tmesh->mVertices[ i ] = *vit++;
    }

	// set primitives type and return result.
	tmesh->mPrimitiveTypes = prim_type;

	return tmesh;
}